

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O1

void __thiscall
slang::syntax::ExternUdpDeclSyntax::ExternUdpDeclSyntax
          (ExternUdpDeclSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token externKeyword,SyntaxList<slang::syntax::AttributeInstanceSyntax> *actualAttributes,
          Token primitive,Token name,UdpPortListSyntax *portList)

{
  size_t sVar1;
  pointer ppAVar2;
  SyntaxNode *pSVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  long lVar6;
  
  uVar5 = externKeyword._0_8_;
  (this->super_MemberSyntax).super_SyntaxNode.kind = ExternUdpDecl;
  (this->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (this->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar4 = *(undefined4 *)&(attributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (attributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (attributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (attributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (attributes->super_SyntaxListBase).childCount;
  sVar1 = (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)
          ._M_extent._M_extent_value;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (attributes->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
       _M_ptr;
  (this->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2768;
  (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)this;
  sVar1 = (this->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar6 = 0;
    do {
      *(ExternUdpDeclSyntax **)(*(long *)((long)ppAVar2 + lVar6) + 8) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (this->externKeyword).kind = (short)uVar5;
  (this->externKeyword).field_0x2 = (char)((ulong)uVar5 >> 0x10);
  (this->externKeyword).numFlags = (NumericTokenFlags)(char)((ulong)uVar5 >> 0x18);
  (this->externKeyword).rawLen = (int)((ulong)uVar5 >> 0x20);
  (this->externKeyword).info = externKeyword.info;
  uVar4 = *(undefined4 *)&(actualAttributes->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar3 = (actualAttributes->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.kind =
       (actualAttributes->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent = pSVar3;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (actualAttributes->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005d2268;
  (this->actualAttributes).super_SyntaxListBase.childCount =
       (actualAttributes->super_SyntaxListBase).childCount;
  sVar1 = (actualAttributes->
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (actualAttributes->
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (this->actualAttributes).
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->actualAttributes).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005d2768;
  (this->primitive).kind = primitive.kind;
  (this->primitive).field_0x2 = primitive._2_1_;
  (this->primitive).numFlags = (NumericTokenFlags)primitive.numFlags.raw;
  (this->primitive).rawLen = primitive.rawLen;
  (this->primitive).info = primitive.info;
  (this->name).kind = name.kind;
  (this->name).field_0x2 = name._2_1_;
  (this->name).numFlags = (NumericTokenFlags)name.numFlags.raw;
  (this->name).rawLen = name.rawLen;
  (this->name).info = name.info;
  (this->portList).ptr = portList;
  (this->actualAttributes).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  sVar1 = (this->actualAttributes).
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar1 != 0) {
    ppAVar2 = (this->actualAttributes).
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar6 = 0;
    do {
      *(ExternUdpDeclSyntax **)(*(long *)((long)ppAVar2 + lVar6) + 8) = this;
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  (portList->super_SyntaxNode).parent = (SyntaxNode *)this;
  return;
}

Assistant:

ExternUdpDeclSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token externKeyword, const SyntaxList<AttributeInstanceSyntax>& actualAttributes, Token primitive, Token name, UdpPortListSyntax& portList) :
        MemberSyntax(SyntaxKind::ExternUdpDecl, attributes), externKeyword(externKeyword), actualAttributes(actualAttributes), primitive(primitive), name(name), portList(&portList) {
        this->actualAttributes.parent = this;
        for (auto child : this->actualAttributes)
            child->parent = this;
        this->portList->parent = this;
    }